

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferSubDataCase::init
          (ModifyAfterWithBufferSubDataCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  EVP_PKEY_CTX *ctx_00;
  char *local_4a8;
  MessageBuilder local_4a0;
  MessageBuilder local_320;
  int local_1a0 [4];
  MessageBuilder local_190;
  ModifyAfterWithBufferSubDataCase *local_10;
  ModifyAfterWithBufferSubDataCase *this_local;
  
  local_10 = this;
  if ((this->m_repeatedUpload & 1U) == 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->
                        super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ).
                        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_320,
                        (char (*) [110])
                        "Testing performance of BufferSubData() command after a draw command that sources data from the target buffer."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
  }
  else {
    pTVar2 = tcu::TestContext::getLog
                       ((this->
                        super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ).
                        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_190,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_190,
                        (char (*) [119])
                        "Testing performance of BufferSubData() command after \"specify buffer contents - draw buffer\" command pair is repeated "
                       );
    local_1a0[0] = 2;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1a0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])" times.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  pTVar2 = tcu::TestContext::getLog
                     ((this->
                      super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_4a0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  local_4a8 = "Buffer contents are fully respecified.\n";
  if ((this->m_partialUpload & 1U) != 0) {
    local_4a8 = "Half of the buffer contents are modified.\n";
  }
  pMVar3 = tcu::MessageBuilder::operator<<(&local_4a0,&local_4a8);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4a0);
  iVar1 = ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          ::init(&this->
                  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void ModifyAfterWithBufferSubDataCase::init (void)
{
	// Log the purpose of the test

	if (m_repeatedUpload)
		m_testCtx.getLog() << tcu::TestLog::Message << "Testing performance of BufferSubData() command after \"specify buffer contents - draw buffer\" command pair is repeated " << (int)NUM_REPEATS << " times." << tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Testing performance of BufferSubData() command after a draw command that sources data from the target buffer." << tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< ((m_partialUpload) ?
			("Half of the buffer contents are modified.\n") :
			("Buffer contents are fully respecified.\n"))
		<< tcu::TestLog::EndMessage;

	ModifyAfterBasicCase<SingleOperationDuration>::init();
}